

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O2

void __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::~ClassSet
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this)

{
  if (this->theitem != (Item *)0x0) {
    spx_free<soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::Item*>(&this->theitem);
  }
  if (this->thekey != (DataKey *)0x0) {
    spx_free<soplex::DataKey*>(&this->thekey);
    return;
  }
  return;
}

Assistant:

~ClassSet()
   {
      if(theitem)
         spx_free(theitem);

      if(thekey)
         spx_free(thekey);
   }